

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O3

void duckdb_brotli::BrotliZopfliCreateCommands
               (size_t num_bytes,size_t block_start,ZopfliNode *nodes,int *dist_cache,
               size_t *last_insert_len,BrotliEncoderParams *params,Command *commands,
               size_t *num_literals)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  ushort uVar5;
  uint16_t uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  uint32_t uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  uint16_t *puVar25;
  bool bVar26;
  
  uVar9 = (nodes->u).next;
  if (uVar9 == 0xffffffff) {
    lVar12 = 0;
  }
  else {
    uVar24 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
    sVar2 = params->stream_offset;
    sVar3 = (params->dictionary).compound.total_size;
    puVar25 = &commands->dist_prefix_;
    lVar18 = 0;
    lVar12 = 0;
    do {
      uVar13 = (ulong)uVar9;
      uVar23 = nodes[lVar12 + uVar13].length;
      uVar17 = nodes[lVar12 + uVar13].dcode_insert_length;
      uVar14 = (ulong)(uVar17 & 0x7ffffff);
      uVar9 = nodes[lVar12 + uVar13].u.next;
      bVar26 = lVar18 == 0;
      lVar18 = lVar18 + -1;
      uVar19 = uVar14;
      if (bVar26) {
        uVar19 = *last_insert_len + uVar14;
        *last_insert_len = 0;
      }
      uVar21 = uVar23 & 0x1ffffff;
      uVar1 = nodes[lVar12 + uVar13].distance;
      iVar15 = uVar21 - (uVar23 >> 0x19);
      uVar16 = iVar15 + 9;
      uVar13 = block_start + sVar2 + lVar12 + uVar14;
      if (uVar24 <= uVar13) {
        uVar13 = uVar24;
      }
      uVar4 = (uVar17 >> 0x1b) - 1;
      if (uVar17 < 0x8000000) {
        uVar4 = uVar1 + 0xf;
      }
      ((Command *)(puVar25 + -7))->insert_len_ = (uint32_t)uVar19;
      *(uint *)(puVar25 + -5) = (uVar16 - uVar23) * 0x2000000 | uVar21;
      uVar11 = (ulong)(params->dist).num_direct_distance_codes;
      uVar20 = uVar11 + 0x10;
      if (uVar4 < uVar20) {
        uVar10 = 0;
        uVar23 = uVar4;
      }
      else {
        uVar10 = (params->dist).distance_postfix_bits;
        bVar8 = (byte)uVar10;
        uVar11 = ((uVar4 - uVar11) + (4L << (bVar8 & 0x3f))) - 0x10;
        uVar23 = 0x1f;
        uVar17 = (uint)uVar11;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar23 == 0; uVar23 = uVar23 - 1) {
          }
        }
        uVar7 = (uVar23 ^ 0xffffffe0) + 0x1f;
        bVar26 = (uVar11 >> ((ulong)uVar7 & 0x3f) & 1) != 0;
        iVar22 = uVar7 - uVar10;
        uVar23 = ((uint)bVar26 + iVar22 * 2 + 0xfffe << (bVar8 & 0x3f)) +
                 (int)uVar20 + (~(-1 << (bVar8 & 0x1f)) & uVar17) | iVar22 * 0x400;
        uVar10 = (uint32_t)(uVar11 - ((ulong)bVar26 + 2 << ((byte)uVar7 & 0x3f)) >> (bVar8 & 0x3f));
      }
      *puVar25 = (uint16_t)uVar23;
      *(uint32_t *)(puVar25 + -3) = uVar10;
      uVar20 = uVar19;
      if (5 < uVar19) {
        if (uVar19 < 0x82) {
          uVar17 = 0x1f;
          uVar7 = (uint)(uVar19 - 2);
          if (uVar7 != 0) {
            for (; uVar7 >> uVar17 == 0; uVar17 = uVar17 - 1) {
            }
          }
          uVar20 = (ulong)((int)(uVar19 - 2 >> ((char)(uVar17 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                           (uVar17 ^ 0xffffffe0) * 2 + 0x40);
        }
        else if (uVar19 < 0x842) {
          uVar7 = (uint32_t)uVar19 - 0x42;
          uVar17 = 0x1f;
          if (uVar7 != 0) {
            for (; uVar7 >> uVar17 == 0; uVar17 = uVar17 - 1) {
            }
          }
          uVar20 = (ulong)((uVar17 ^ 0xffe0) + 0x2a);
        }
        else {
          uVar20 = 0x15;
          if (0x1841 < uVar19) {
            uVar20 = (ulong)(ushort)(0x17 - (uVar19 < 0x5842));
          }
        }
      }
      if (uVar16 < 10) {
        uVar17 = iVar15 + 7;
      }
      else if (uVar16 < 0x86) {
        uVar16 = iVar15 + 3;
        uVar17 = 0x1f;
        if (uVar16 != 0) {
          for (; uVar16 >> uVar17 == 0; uVar17 = uVar17 - 1) {
          }
        }
        uVar17 = (int)((ulong)(long)(int)uVar16 >> ((char)(uVar17 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar17 ^ 0xffffffe0) * 2 + 0x42;
      }
      else {
        uVar17 = 0x17;
        if (uVar16 < 0x846) {
          uVar17 = 0x1f;
          if (iVar15 - 0x3dU != 0) {
            for (; iVar15 - 0x3dU >> uVar17 == 0; uVar17 = uVar17 - 1) {
            }
          }
          uVar17 = (uVar17 ^ 0xffe0) + 0x2c;
        }
      }
      uVar5 = (ushort)uVar17;
      uVar6 = (uVar5 & 7) + ((ushort)uVar20 & 7) * 8;
      if ((((uVar23 & 0x3ff) == 0) && ((ushort)uVar20 < 8)) && (uVar5 < 0x10)) {
        if (7 < uVar5) {
          uVar6 = uVar6 + 0x40;
        }
      }
      else {
        iVar15 = (int)((uVar20 & 0xffff) >> 3) * 3 + ((uVar17 & 0xffff) >> 3);
        uVar6 = uVar6 + ((ushort)(0x520d40 >> ((char)iVar15 * '\x02' & 0x1fU)) & 0xc0) +
                        (short)iVar15 * 0x40 + 0x40;
      }
      puVar25[-1] = uVar6;
      if (((ulong)uVar1 <= uVar13 + sVar3) && (uVar4 != 0)) {
        dist_cache[3] = dist_cache[2];
        *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
        *dist_cache = uVar1;
      }
      *num_literals = *num_literals + uVar19;
      lVar12 = lVar12 + uVar14 + (ulong)uVar21;
      puVar25 = puVar25 + 8;
    } while (uVar9 != 0xffffffff);
  }
  *last_insert_len = *last_insert_len + (num_bytes - lVar12);
  return;
}

Assistant:

void duckdb_brotli::BrotliZopfliCreateCommands(const size_t num_bytes,
    const size_t block_start, const ZopfliNode* nodes, int* dist_cache,
    size_t* last_insert_len, const BrotliEncoderParams* params,
    Command* commands, size_t* num_literals) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  size_t pos = 0;
  uint32_t offset = nodes[0].u.next;
  size_t i;
  size_t gap = params->dictionary.compound.total_size;
  for (i = 0; offset != BROTLI_UINT32_MAX; i++) {
    const ZopfliNode* next = &nodes[pos + offset];
    size_t copy_length = ZopfliNodeCopyLength(next);
    size_t insert_length = next->dcode_insert_length & 0x7FFFFFF;
    pos += insert_length;
    offset = next->u.next;
    if (i == 0) {
      insert_length += *last_insert_len;
      *last_insert_len = 0;
    }
    {
      size_t distance = ZopfliNodeCopyDistance(next);
      size_t len_code = ZopfliNodeLengthCode(next);
      size_t dictionary_start = BROTLI_MIN(size_t,
          block_start + pos + stream_offset, max_backward_limit);
      BROTLI_BOOL is_dictionary =
          TO_BROTLI_BOOL(distance > dictionary_start + gap);
      size_t dist_code = ZopfliNodeDistanceCode(next);
      InitCommand(&commands[i], &params->dist, insert_length,
          copy_length, (int)len_code - (int)copy_length, dist_code);

      if (!is_dictionary && dist_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = (int)distance;
      }
    }

    *num_literals += insert_length;
    pos += copy_length;
  }
  *last_insert_len += num_bytes - pos;
}